

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ModuleDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModuleDeclarationSyntax,slang::syntax::SyntaxKind&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ModuleHeaderSyntax&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxKind *args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,ModuleHeaderSyntax *args_2,
          SyntaxList<slang::syntax::MemberSyntax> *args_3,Token *args_4,
          NamedBlockClauseSyntax **args_5)

{
  Token endmodule;
  ModuleDeclarationSyntax *this_00;
  
  this_00 = (ModuleDeclarationSyntax *)allocate(this,0x90,8);
  endmodule.kind = args_4->kind;
  endmodule._2_1_ = args_4->field_0x2;
  endmodule.numFlags.raw = (args_4->numFlags).raw;
  endmodule.rawLen = args_4->rawLen;
  endmodule.info = args_4->info;
  slang::syntax::ModuleDeclarationSyntax::ModuleDeclarationSyntax
            (this_00,*args,args_1,args_2,args_3,endmodule,*args_5);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }